

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_instance.c
# Opt level: O0

_Bool al_set_sample_instance_pan(ALLEGRO_SAMPLE_INSTANCE *spl,float val)

{
  long in_RDI;
  float in_XMM0_Da;
  ALLEGRO_MIXER *unaff_retaddr;
  ALLEGRO_MIXER *mixer;
  char *in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  int error;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var1;
  
  error = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  if ((*(long *)(in_RDI + 0xf8) == 0) || ((*(byte *)(in_RDI + 0x100) & 1) == 0)) {
    if (((in_XMM0_Da == -1000.0) && (!NAN(in_XMM0_Da))) ||
       ((-1.0 <= in_XMM0_Da && (in_XMM0_Da <= 1.0)))) {
      if (((*(float *)(in_RDI + 0xb8) != in_XMM0_Da) ||
          (NAN(*(float *)(in_RDI + 0xb8)) || NAN(in_XMM0_Da))) &&
         (*(float *)(in_RDI + 0xb8) = in_XMM0_Da, *(long *)(in_RDI + 0xf8) != 0)) {
        maybe_lock_mutex((ALLEGRO_MUTEX *)0x108cc5);
        _al_kcm_mixer_rejig_sample_matrix
                  (unaff_retaddr,
                   (ALLEGRO_SAMPLE_INSTANCE *)
                   CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
        maybe_unlock_mutex((ALLEGRO_MUTEX *)0x108ce5);
      }
      _Var1 = true;
    }
    else {
      _al_set_error(error,in_stack_ffffffffffffffd8);
      _Var1 = false;
    }
  }
  else {
    _al_set_error(error,in_stack_ffffffffffffffd8);
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

bool al_set_sample_instance_pan(ALLEGRO_SAMPLE_INSTANCE *spl, float val)
{
   ASSERT(spl);

   if (spl->parent.u.ptr && spl->parent.is_voice) {
      _al_set_error(ALLEGRO_GENERIC_ERROR,
         "Could not set panning of sample attached to voice");
      return false;
   }
   if (val != ALLEGRO_AUDIO_PAN_NONE && (val < -1.0 || val > 1.0)) {
      _al_set_error(ALLEGRO_GENERIC_ERROR, "Invalid pan value");
      return false;
   }

   if (spl->pan != val) {
      spl->pan = val;

      /* If attached to a mixer already, need to recompute the sample
       * matrix to take into account the panning.
       */
      if (spl->parent.u.mixer) {
         ALLEGRO_MIXER *mixer = spl->parent.u.mixer;

         maybe_lock_mutex(spl->mutex);
         _al_kcm_mixer_rejig_sample_matrix(mixer, spl);
         maybe_unlock_mutex(spl->mutex);
      }
   }

   return true;
}